

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::SequenceExprSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if (((((kind == AndSequenceExpr) || (kind == BinaryEventExpression)) ||
       (kind == ClockingSequenceExpr)) ||
      (((kind == DelayedSequenceExpr || (kind == FirstMatchSequenceExpr)) ||
       ((kind == IntersectSequenceExpr ||
        ((kind == OrSequenceExpr || (kind == ParenthesizedEventExpression)))))))) ||
     ((kind == ParenthesizedSequenceExpr ||
      ((((kind == SignalEventExpression || (kind == SimpleSequenceExpr)) ||
        (kind == ThroughoutSequenceExpr)) || (kind == WithinSequenceExpr)))))) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SequenceExprSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AndSequenceExpr:
        case SyntaxKind::BinaryEventExpression:
        case SyntaxKind::ClockingSequenceExpr:
        case SyntaxKind::DelayedSequenceExpr:
        case SyntaxKind::FirstMatchSequenceExpr:
        case SyntaxKind::IntersectSequenceExpr:
        case SyntaxKind::OrSequenceExpr:
        case SyntaxKind::ParenthesizedEventExpression:
        case SyntaxKind::ParenthesizedSequenceExpr:
        case SyntaxKind::SignalEventExpression:
        case SyntaxKind::SimpleSequenceExpr:
        case SyntaxKind::ThroughoutSequenceExpr:
        case SyntaxKind::WithinSequenceExpr:
            return true;
        default:
            return false;
    }
}